

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_zip_entry_reset_cursor(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  void *pvVar2;
  SyArchiveEntry *pEntry;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  if ((nArg < 1) || (iVar1 = jx9_value_is_resource(*apArg), iVar1 == 0)) {
    jx9_context_throw_error(pCtx,1,"Expecting a ZIP archive entry");
    jx9_result_bool(pCtx,0);
    return 0;
  }
  pvVar2 = jx9_value_to_resource(*apArg);
  if ((pvVar2 != (void *)0x0) && (*(int *)((long)pvVar2 + 0xa0) == -0x21529ca6)) {
    *(undefined4 *)((long)pvVar2 + 8) = 0;
    jx9_result_bool(pCtx,1);
    return 0;
  }
  jx9_context_throw_error(pCtx,1,"Expecting a ZIP archive entry");
  jx9_result_bool(pCtx,0);
  return 0;
}

Assistant:

static int jx9Builtin_zip_entry_reset_cursor(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	SyArchiveEntry *pEntry;
	if( nArg < 1 || !jx9_value_is_resource(apArg[0]) ){
		/* Missing/Invalid arguments */
		jx9_context_throw_error(pCtx, JX9_CTX_ERR, "Expecting a ZIP archive entry");
		/* return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Make sure we are dealing with a valid ZIP archive entry */
	pEntry = (SyArchiveEntry *)jx9_value_to_resource(apArg[0]);
	if( SXARCH_ENTRY_INVALID(pEntry) ){
		jx9_context_throw_error(pCtx, JX9_CTX_ERR, "Expecting a ZIP archive entry");
		/* return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Reset the cursor */
	pEntry->nReadCount = 0;
	/* Return TRUE */
	jx9_result_bool(pCtx, 1);
	return JX9_OK;
}